

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateGlobalTarget(cmGlobalGenerator *this,GlobalTargetInfo *gti,cmMakefile *mf)

{
  pointer pbVar1;
  int iVar2;
  cmTarget *this_00;
  string *d;
  pointer name;
  pair<cmTarget_&,_bool> pVar3;
  allocator<char> local_1b1;
  string local_1b0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_190;
  string local_178;
  cmCustomCommand cc;
  
  pVar3 = cmMakefile::CreateNewTarget(mf,&gti->Name,GLOBAL_TARGET,gti->PerConfig);
  this_00 = pVar3.first;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cc,"EXCLUDE_FROM_ALL",(allocator<char> *)&local_1b0);
    cmTarget::SetProperty(this_00,(string *)&cc,"TRUE");
    std::__cxx11::string::~string((string *)&cc);
    cmCustomCommand::cmCustomCommand(&cc);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_190,
               &(gti->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    cmCustomCommand::SetCommandLines(&cc,(cmCustomCommandLines *)&local_190);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_190);
    cmCustomCommand::SetWorkingDirectory(&cc,(gti->WorkingDir)._M_dataplus._M_p);
    cc.StdPipesUTF8 = gti->StdPipesUTF8;
    cmCustomCommand::SetUsesTerminal(&cc,gti->UsesTerminal);
    cmTarget::AddPostBuildCommand(this_00,&cc);
    if ((gti->Message)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"EchoString",(allocator<char> *)&local_178);
      cmTarget::SetProperty(this_00,&local_1b0,(cmValue)&gti->Message);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    pbVar1 = (gti->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name = (gti->Depends).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
      cmTarget::AddUtility(this_00,name,false,(cmMakefile *)0x0);
    }
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x2c])(this);
    if ((char)iVar2 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"FOLDER",&local_1b1);
      GetPredefinedTargetsFolder_abi_cxx11_(&local_178,this);
      cmTarget::SetProperty(this_00,&local_1b0,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    cmCustomCommand::~cmCustomCommand(&cc);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGlobalTarget(GlobalTargetInfo const& gti,
                                           cmMakefile* mf)
{
  // Package
  auto tb =
    mf->CreateNewTarget(gti.Name, cmStateEnums::GLOBAL_TARGET, gti.PerConfig);

  // Do nothing if gti.Name is already used
  if (!tb.second) {
    return;
  }

  cmTarget& target = tb.first;
  target.SetProperty("EXCLUDE_FROM_ALL", "TRUE");

  // Store the custom command in the target.
  cmCustomCommand cc;
  cc.SetCommandLines(gti.CommandLines);
  cc.SetWorkingDirectory(gti.WorkingDir.c_str());
  cc.SetStdPipesUTF8(gti.StdPipesUTF8);
  cc.SetUsesTerminal(gti.UsesTerminal);
  target.AddPostBuildCommand(std::move(cc));
  if (!gti.Message.empty()) {
    target.SetProperty("EchoString", gti.Message);
  }
  for (std::string const& d : gti.Depends) {
    target.AddUtility(d, false);
  }

  // Organize in the "predefined targets" folder:
  //
  if (this->UseFolderProperty()) {
    target.SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
  }
}